

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateServiceOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  bool bVar1;
  int i;
  int index;
  
  bVar1 = IsLite(*(FileDescriptor **)(service + 0x10));
  if ((bVar1) &&
     ((*(char *)(*(long *)(*(long *)(service + 0x10) + 0xa0) + 0xa3) != '\0' ||
      (*(char *)(*(long *)(*(long *)(service + 0x10) + 0xa0) + 0xa4) == '\x01')))) {
    AddError(this,*(string **)(service + 8),&proto->super_Message,NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services unless you set both options cc_generic_services and java_generic_sevices to false."
            );
  }
  for (index = 0; index < *(int *)(service + 0x20); index = index + 1) {
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
              (&(proto->method_).super_RepeatedPtrFieldBase,index);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateServiceOptions(ServiceDescriptor* service,
    const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_sevices to false.");
  }

  VALIDATE_OPTIONS_FROM_ARRAY(service, method, Method);
}